

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::
Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
          (Printer *this,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,string_view text)

{
  PrintOptions opts_00;
  string_view format;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  size_t local_58;
  char *pcStack_50;
  undefined1 local_48 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
  pop;
  undefined1 uStack_2d;
  undefined2 uStack_2b;
  PrintOptions opts;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Printer *this_local;
  string_view text_local;
  
  PrintOptions::PrintOptions((PrintOptions *)(pop.storage_.callback_buffer_ + 7));
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
              *)local_48,this,vars);
  local_58 = text._M_len;
  pcStack_50 = text._M_str;
  absl::lts_20250127::
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Span
            (&local_68);
  opts_00.checks_are_debug_only = true;
  opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       stack0xffffffffffffffcf;
  opts_00.use_substitution_map = true;
  opts_00.use_curly_brace_substitutions = (bool)uStack_2d;
  opts_00.allow_digit_substitutions = false;
  opts_00._6_2_ = uStack_2b;
  format._M_str = pcStack_50;
  format._M_len = local_58;
  opts_00.use_annotation_frames =
       (bool)opts.loc.
             super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>.
             _0_1_;
  PrintImpl(this,format,local_68,opts_00);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1025:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1025:28)>
              *)local_48);
  return;
}

Assistant:

void Printer::Print(const Map& vars, absl::string_view text) {
  PrintOptions opts;
  opts.checks_are_debug_only = true;
  opts.use_substitution_map = true;
  opts.allow_digit_substitutions = false;

  auto pop = WithVars(&vars);
  PrintImpl(text, {}, opts);
}